

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.h
# Opt level: O0

void __thiscall XTreeNode::removeElements(XTreeNode *this)

{
  long lVar1;
  bool bVar2;
  XTreeNode **ppXVar3;
  QMap<QString,_XTreeNode_*> *in_RDI;
  long in_FS_OFFSET;
  ConstIterator end;
  ConstIterator it;
  XTreeNode *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QString,_XTreeNode_*>::constBegin((QMap<QString,_XTreeNode_*> *)in_stack_ffffffffffffffc8);
  QMap<QString,_XTreeNode_*>::constEnd((QMap<QString,_XTreeNode_*> *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar2 = ::operator!=((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    ppXVar3 = QMap<QString,_XTreeNode_*>::const_iterator::operator*((const_iterator *)0x24e3dd);
    (*((*ppXVar3)->super_XNode)._vptr_XNode[3])();
    ppXVar3 = QMap<QString,_XTreeNode_*>::const_iterator::value((const_iterator *)0x24e3f0);
    in_stack_ffffffffffffffc8 = *ppXVar3;
    if (in_stack_ffffffffffffffc8 != (XTreeNode *)0x0) {
      (*(in_stack_ffffffffffffffc8->super_XNode)._vptr_XNode[1])();
    }
    QMap<QString,_XTreeNode_*>::const_iterator::operator++
              ((const_iterator *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  QMap<QString,_XTreeNode_*>::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void removeElements() override {
        ChildrenMap::ConstIterator it = children.constBegin();
        ChildrenMap::ConstIterator end = children.constEnd();
        for( ; it != end; it++) {
            (*it)->removeElements();
            delete it.value();
        }
        children.clear();
    }